

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

void __thiscall sqlite::Database::Database(Database *this,string *path)

{
  sqlite3 *this_00;
  string *in_RSI;
  unique_ptr<sqlite3,_std::function<void_(sqlite3_*)>_> *in_RDI;
  pointer in_stack_ffffffffffffff78;
  string *this_01;
  string local_30 [32];
  
  this_01 = local_30;
  std::__cxx11::string::string(this_01,in_RSI);
  this_00 = Database::anon_class_32_1_89901123::operator()((anon_class_32_1_89901123 *)in_RSI);
  std::function<void(sqlite3*)>::
  function<sqlite::Database::Database(std::__cxx11::string)::_lambda(sqlite3*)_1_,void>
            ((function<void_(sqlite3_*)> *)this_00,(anon_class_1_0_00000001 *)this_01);
  std::unique_ptr<sqlite3,std::function<void(sqlite3*)>>::
  unique_ptr<std::function<void(sqlite3*)>,void>
            (in_RDI,in_stack_ffffffffffffff78,
             (__enable_if_t<_is_lvalue_reference<function<void_(sqlite3_*)>_>::value,_std::function<void_(sqlite3_*)>_&&>
              )0x1b1674);
  std::function<void_(sqlite3_*)>::~function((function<void_(sqlite3_*)> *)0x1b167e);
  Database(std::__cxx11::string)::{lambda()#1}::~basic_string((anon_class_32_1_89901123 *)0x1b1688);
  return;
}

Assistant:

explicit Database(const std::string path)
      : db(
            [path]() {
              sqlite3* _db;
              int rc = sqlite3_open(path.c_str(), &_db);

              if (rc != SQLITE_OK) {
                throw SqliteException(
                    "can't open database: " + std::string(sqlite3_errmsg(_db)),
                    rc);
              }

              return _db;
            }(),
            [](sqlite3* _db) { sqlite3_close(_db); }) {}